

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
::find_non_soo<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
           *this,key_arg<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
                 *key,size_t hash)

{
  ctrl_t *pcVar1;
  slot_type *psVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint32_t uVar5;
  int iVar6;
  ctrl_t *pcVar7;
  slot_type *psVar8;
  size_t sVar9;
  ulong extraout_RDX;
  ulong uVar10;
  ushort x;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m128i match;
  undefined1 auVar14 [16];
  ctrl_t cVar15;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  undefined1 auVar16 [16];
  iterator iVar32;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_60;
  ctrl_t local_48;
  ctrl_t cStack_47;
  ctrl_t cStack_46;
  ctrl_t cStack_45;
  ctrl_t cStack_44;
  ctrl_t cStack_43;
  ctrl_t cStack_42;
  ctrl_t cStack_41;
  ctrl_t cStack_40;
  ctrl_t cStack_3f;
  ctrl_t cStack_3e;
  ctrl_t cStack_3d;
  ctrl_t cStack_3c;
  ctrl_t cStack_3b;
  ctrl_t cStack_3a;
  ctrl_t cStack_39;
  undefined1 local_38 [16];
  
  bVar4 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                    *)this);
  if (bVar4) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe2a,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, K = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>]"
                 );
  }
  probe(&local_60,(CommonFields *)this,hash);
  pcVar7 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
           ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                      *)this);
  auVar12 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar12 = pshuflw(auVar12,auVar12,0);
  uVar11 = auVar12._0_4_;
  local_38._4_4_ = uVar11;
  local_38._0_4_ = uVar11;
  local_38._8_4_ = uVar11;
  local_38._12_4_ = uVar11;
  while( true ) {
    pcVar1 = pcVar7 + local_60.offset_;
    auVar12[0] = -(local_38[0] == *pcVar1);
    auVar12[1] = -(local_38[1] == pcVar1[1]);
    auVar12[2] = -(local_38[2] == pcVar1[2]);
    auVar12[3] = -(local_38[3] == pcVar1[3]);
    auVar12[4] = -(local_38[4] == pcVar1[4]);
    auVar12[5] = -(local_38[5] == pcVar1[5]);
    auVar12[6] = -(local_38[6] == pcVar1[6]);
    auVar12[7] = -(local_38[7] == pcVar1[7]);
    auVar12[8] = -(local_38[8] == pcVar1[8]);
    auVar12[9] = -(local_38[9] == pcVar1[9]);
    auVar12[10] = -(local_38[10] == pcVar1[10]);
    auVar12[0xb] = -(local_38[0xb] == pcVar1[0xb]);
    auVar12[0xc] = -(local_38[0xc] == pcVar1[0xc]);
    auVar12[0xd] = -(local_38[0xd] == pcVar1[0xd]);
    auVar12[0xe] = -(local_38[0xe] == pcVar1[0xe]);
    auVar12[0xf] = -(local_38[0xf] == pcVar1[0xf]);
    cVar15 = *pcVar1;
    cVar17 = pcVar1[1];
    cVar18 = pcVar1[2];
    cVar19 = pcVar1[3];
    cVar20 = pcVar1[4];
    cVar21 = pcVar1[5];
    cVar22 = pcVar1[6];
    cVar23 = pcVar1[7];
    cVar24 = pcVar1[8];
    cVar25 = pcVar1[9];
    cVar26 = pcVar1[10];
    cVar27 = pcVar1[0xb];
    cVar28 = pcVar1[0xc];
    cVar29 = pcVar1[0xd];
    cVar30 = pcVar1[0xe];
    cVar31 = pcVar1[0xf];
    for (x = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf;
        x != 0; x = x - 1 & x) {
      local_48 = cVar15;
      cStack_47 = cVar17;
      cStack_46 = cVar18;
      cStack_45 = cVar19;
      cStack_44 = cVar20;
      cStack_43 = cVar21;
      cStack_42 = cVar22;
      cStack_41 = cVar23;
      cStack_40 = cVar24;
      cStack_3f = cVar25;
      cStack_3e = cVar26;
      cStack_3d = cVar27;
      cStack_3c = cVar28;
      cStack_3b = cVar29;
      cStack_3a = cVar30;
      cStack_39 = cVar31;
      uVar5 = TrailingZeros<unsigned_short>(x);
      psVar8 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
               ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                             *)this);
      uVar10 = uVar5 + local_60.offset_ & local_60.mask_;
      psVar2 = psVar8 + uVar10;
      auVar14._0_4_ = -(uint)(*(int *)&key->first == *(int *)&psVar2->first);
      auVar14._4_4_ = -(uint)(*(int *)((long)&key->first + 4) == *(int *)((long)&psVar2->first + 4))
      ;
      auVar14._8_4_ = -(uint)(*(int *)&key->second == *(int *)&psVar2->second);
      auVar14._12_4_ =
           -(uint)(*(int *)((long)&key->second + 4) == *(int *)((long)&psVar2->second + 4));
      auVar13._4_4_ = auVar14._0_4_;
      auVar13._0_4_ = auVar14._4_4_;
      auVar13._8_4_ = auVar14._12_4_;
      auVar13._12_4_ = auVar14._8_4_;
      iVar6 = movmskpd((int)psVar8,auVar13 & auVar14);
      if (iVar6 == 3) {
        iVar32 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                 ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                                *)this,uVar10);
        return iVar32;
      }
      cVar15 = local_48;
      cVar17 = cStack_47;
      cVar18 = cStack_46;
      cVar19 = cStack_45;
      cVar20 = cStack_44;
      cVar21 = cStack_43;
      cVar22 = cStack_42;
      cVar23 = cStack_41;
      cVar24 = cStack_40;
      cVar25 = cStack_3f;
      cVar26 = cStack_3e;
      cVar27 = cStack_3d;
      cVar28 = cStack_3c;
      cVar29 = cStack_3b;
      cVar30 = cStack_3a;
      cVar31 = cStack_39;
    }
    auVar16[0] = -(cVar15 == kEmpty);
    auVar16[1] = -(cVar17 == kEmpty);
    auVar16[2] = -(cVar18 == kEmpty);
    auVar16[3] = -(cVar19 == kEmpty);
    auVar16[4] = -(cVar20 == kEmpty);
    auVar16[5] = -(cVar21 == kEmpty);
    auVar16[6] = -(cVar22 == kEmpty);
    auVar16[7] = -(cVar23 == kEmpty);
    auVar16[8] = -(cVar24 == kEmpty);
    auVar16[9] = -(cVar25 == kEmpty);
    auVar16[10] = -(cVar26 == kEmpty);
    auVar16[0xb] = -(cVar27 == kEmpty);
    auVar16[0xc] = -(cVar28 == kEmpty);
    auVar16[0xd] = -(cVar29 == kEmpty);
    auVar16[0xe] = -(cVar30 == kEmpty);
    auVar16[0xf] = -(cVar31 == kEmpty);
    if ((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar16 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar16 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar16 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar16 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar16 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar16 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar16 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar16 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar16 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar16 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar16 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar31 == kEmpty)
    break;
    uVar10 = local_60.index_ + 0x10;
    local_60.offset_ = local_60.index_ + local_60.offset_ + 0x10 & local_60.mask_;
    local_60.index_ = uVar10;
    sVar9 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                        *)this);
    if (sVar9 < uVar10) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe37,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, K = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>]"
                   );
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              *)this);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = extraout_RDX;
  return (iterator)(auVar3 << 0x40);
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }